

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O0

void __thiscall leveldb::anon_unknown_3::DBIter::Prev(DBIter *this)

{
  int iVar1;
  ulong uVar2;
  DBIter *extraout_RDX;
  string *in_RDI;
  DBIter *in_stack_00000050;
  string *s;
  Slice *in_stack_ffffffffffffffa8;
  DBIter *in_stack_ffffffffffffffb0;
  DBIter *in_stack_ffffffffffffffc0;
  Slice local_38;
  undefined1 local_28 [16];
  Slice local_18;
  
  if (*(int *)&in_RDI[4].field_2 == 0) {
    local_28 = (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x40))();
    local_18 = ExtractUserKey((Slice *)in_RDI);
    SaveKey(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RDI);
    do {
      (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x38))();
      uVar2 = (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x10))();
      if ((uVar2 & 1) == 0) {
        in_RDI[4].field_2._M_local_buf[4] = '\0';
        std::__cxx11::string::clear();
        ClearSavedValue(in_stack_ffffffffffffffc0);
        return;
      }
      s = *(string **)&in_RDI[1].field_2;
      (**(code **)(**(long **)((long)&in_RDI[1].field_2 + 8) + 0x40))();
      in_stack_ffffffffffffffc0 = extraout_RDX;
      local_38 = ExtractUserKey((Slice *)in_RDI);
      Slice::Slice((Slice *)in_RDI,s);
      iVar1 = (**(code **)(*(long *)s + 0x10))(s,&local_38,&stack0xffffffffffffffa8);
    } while (-1 < iVar1);
    *(undefined4 *)&in_RDI[4].field_2 = 1;
  }
  FindPrevUserEntry(in_stack_00000050);
  return;
}

Assistant:

void DBIter::Prev() {
  assert(valid_);

  if (direction_ == kForward) {  // Switch directions?
    // iter_ is pointing at the current entry.  Scan backwards until
    // the key changes so we can use the normal reverse scanning code.
    assert(iter_->Valid());  // Otherwise valid_ would have been false
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
    while (true) {
      iter_->Prev();
      if (!iter_->Valid()) {
        valid_ = false;
        saved_key_.clear();
        ClearSavedValue();
        return;
      }
      if (user_comparator_->Compare(ExtractUserKey(iter_->key()), saved_key_) <
          0) {
        break;
      }
    }
    direction_ = kReverse;
  }

  FindPrevUserEntry();
}